

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsfil.cpp
# Opt level: O3

int __thiscall CTcSymPropBase::write_to_sym_file(CTcSymPropBase *this,CVmFile *fp)

{
  uint16_t tmp;
  undefined8 in_RAX;
  char b_1 [1];
  char b [2];
  undefined8 uStack_18;
  
  uStack_18 = CONCAT26(*(undefined2 *)
                        &(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                         super_CVmHashEntry.field_0x24,(int6)in_RAX);
  CVmFile::write_bytes(fp,(char *)((long)&uStack_18 + 6),2);
  CTcSymbolBase::write_name_to_file((CTcSymbolBase *)this,fp);
  uStack_18 = CONCAT26(uStack_18._6_2_,CONCAT15(this->field_0x2a,(undefined5)uStack_18)) &
              0xffff07ffffffffff;
  CVmFile::write_bytes(fp,(char *)((long)&uStack_18 + 5),1);
  return 1;
}

Assistant:

int CTcSymPropBase::write_to_sym_file(CVmFile *fp)
{
    /* inherit the default handling */
    int ret = CTcSymbol::write_to_sym_file(fp);
    if (ret)
    {
        /* encode and write our flags */
        char flags = 0;
        if (ref_)
            flags |= 1;
        if (vocab_)
            flags |= 2;
        if (weak_)
            flags |= 4;
        
        fp->write_byte(flags);
    }

    return ret;
}